

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O3

void duckdb_je_buf_writer_terminate(tsdn_t *tsdn,buf_writer_t *buf_writer)

{
  long *plVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  char *ptr;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  undefined8 uVar8;
  rtree_leaf_elm_t *prVar9;
  rtree_leaf_elm_t *in_RDX;
  rtree_leaf_elm_t *extraout_RDX;
  rtree_leaf_elm_t *extraout_RDX_00;
  rtree_leaf_elm_t *extraout_RDX_01;
  rtree_leaf_elm_t *extraout_RDX_02;
  rtree_leaf_elm_t *extraout_RDX_03;
  rtree_leaf_elm_t *extraout_RDX_04;
  rtree_leaf_elm_t *extraout_RDX_05;
  ulong uVar10;
  uint uVar11;
  rtree_ctx_t *prVar12;
  rtree_ctx_t local_1b0;
  
  if (buf_writer->buf != (char *)0x0) {
    buf_writer->buf[buf_writer->buf_end] = '\0';
    (*buf_writer->write_cb)(buf_writer->cbopaque,buf_writer->buf);
    buf_writer->buf_end = 0;
    in_RDX = extraout_RDX;
  }
  if ((buf_writer->internal_buf == true) && (ptr = buf_writer->buf, ptr != (char *)0x0)) {
    if (tsdn == (tsdn_t *)0x0) {
      prVar12 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar12);
      in_RDX = extraout_RDX_00;
    }
    else {
      prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar11 = (uint)((ulong)ptr >> 0x1e) & 0xf;
    uVar10 = (ulong)ptr & 0xffffffffc0000000;
    puVar2 = (ulong *)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    uVar5 = *(ulong *)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    if (uVar5 == uVar10) {
      prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (prVar12->l2_cache[0].leafkey == uVar10) {
      in_RDX = prVar12->l2_cache[0].leaf;
      prVar12->l2_cache[0].leafkey = uVar5;
      prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar10;
      puVar2[1] = (ulong)in_RDX;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(in_RDX->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      in_RDX = (rtree_leaf_elm_t *)0x118;
      do {
        if (*(ulong *)((long)&prVar12[-1].l2_cache[7].leaf + (long)in_RDX) == uVar10) {
          uVar7 = *(ulong *)((long)&prVar12->cache[0].leafkey + (long)&(in_RDX->le_bits).repr);
          puVar3 = (undefined8 *)((long)&prVar12[-1].l2_cache[6].leaf + (long)in_RDX);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&prVar12[-1].l2_cache[7].leaf + (long)in_RDX);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          *(ulong *)((long)&prVar12[-1].l2_cache[6].leaf + (long)in_RDX) = uVar5;
          *(ulong *)((long)&(in_RDX->le_bits).repr + (long)&prVar12[-1].l2_cache[7].leafkey) =
               puVar2[1];
          *puVar2 = uVar10;
          puVar2[1] = uVar7;
          prVar9 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar7);
          goto LAB_01d5dd3b;
        }
        in_RDX = in_RDX + 2;
      } while (in_RDX != (rtree_leaf_elm_t *)0x188);
      prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&duckdb_je_arena_emap_global.rtree,prVar12,(uintptr_t)ptr,true,false)
      ;
      in_RDX = extraout_RDX_03;
    }
LAB_01d5dd3b:
    pvVar6 = duckdb_je_arenas
             [*(uint *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff
             ].repr;
    if (tsdn == (tsdn_t *)0x0) {
      prVar12 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar12);
      in_RDX = extraout_RDX_01;
    }
    else {
      prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    puVar2 = (ulong *)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    uVar5 = *(ulong *)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    if (uVar5 == uVar10) {
      prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (prVar12->l2_cache[0].leafkey == uVar10) {
      in_RDX = prVar12->l2_cache[0].leaf;
      prVar12->l2_cache[0].leafkey = uVar5;
      prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar10;
      puVar2[1] = (ulong)in_RDX;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(in_RDX->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      in_RDX = (rtree_leaf_elm_t *)0x118;
      do {
        if (*(ulong *)((long)&prVar12[-1].l2_cache[7].leaf + (long)in_RDX) == uVar10) {
          uVar7 = *(ulong *)((long)&prVar12->cache[0].leafkey + (long)&(in_RDX->le_bits).repr);
          puVar3 = (undefined8 *)((long)&prVar12[-1].l2_cache[6].leaf + (long)in_RDX);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&prVar12[-1].l2_cache[7].leaf + (long)in_RDX);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          *(ulong *)((long)&prVar12[-1].l2_cache[6].leaf + (long)in_RDX) = uVar5;
          *(ulong *)((long)&(in_RDX->le_bits).repr + (long)&prVar12[-1].l2_cache[7].leafkey) =
               puVar2[1];
          *puVar2 = uVar10;
          puVar2[1] = uVar7;
          prVar9 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar7);
          goto LAB_01d5dd92;
        }
        in_RDX = in_RDX + 2;
      } while (in_RDX != (rtree_leaf_elm_t *)0x188);
      prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&duckdb_je_arena_emap_global.rtree,prVar12,(uintptr_t)ptr,true,false)
      ;
      in_RDX = extraout_RDX_04;
    }
LAB_01d5dd92:
    LOCK();
    plVar1 = (long *)((long)pvVar6 + 0x48);
    *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar9->le_bits).repr >> 0x30];
    UNLOCK();
    if (tsdn == (tsdn_t *)0x0) {
      prVar12 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar12);
      in_RDX = extraout_RDX_02;
    }
    else {
      prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    puVar2 = (ulong *)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    uVar5 = *(ulong *)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    if (uVar5 == uVar10) {
      prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (prVar12->l2_cache[0].leafkey == uVar10) {
      in_RDX = prVar12->l2_cache[0].leaf;
      prVar12->l2_cache[0].leafkey = uVar5;
      prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar10;
      puVar2[1] = (ulong)in_RDX;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(in_RDX->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      in_RDX = (rtree_leaf_elm_t *)0x118;
      do {
        if (*(ulong *)((long)&prVar12[-1].l2_cache[7].leaf + (long)in_RDX) == uVar10) {
          uVar7 = *(ulong *)((long)&prVar12->cache[0].leafkey + (long)&(in_RDX->le_bits).repr);
          puVar3 = (undefined8 *)((long)&prVar12[-1].l2_cache[6].leaf + (long)in_RDX);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&prVar12[-1].l2_cache[7].leaf + (long)in_RDX);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          *(ulong *)((long)&prVar12[-1].l2_cache[6].leaf + (long)in_RDX) = uVar5;
          *(ulong *)((long)&(in_RDX->le_bits).repr + (long)&prVar12[-1].l2_cache[7].leafkey) =
               puVar2[1];
          *puVar2 = uVar10;
          puVar2[1] = uVar7;
          prVar9 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar7);
          goto LAB_01d5dddd;
        }
        in_RDX = in_RDX + 2;
      } while (in_RDX != (rtree_leaf_elm_t *)0x188);
      prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&duckdb_je_arena_emap_global.rtree,prVar12,(uintptr_t)ptr,true,false)
      ;
      in_RDX = extraout_RDX_05;
    }
LAB_01d5dddd:
    if (((ulong)(prVar9->le_bits).repr & 1) == 0) {
      arena_dalloc_large_no_tcache(tsdn,ptr,(szind_t)in_RDX);
    }
    else {
      duckdb_je_arena_dalloc_small(tsdn,ptr);
    }
  }
  return;
}

Assistant:

void
buf_writer_terminate(tsdn_t *tsdn, buf_writer_t *buf_writer) {
	buf_writer_assert(buf_writer);
	buf_writer_flush(buf_writer);
	if (buf_writer->internal_buf) {
		buf_writer_free_internal_buf(tsdn, buf_writer->buf);
	}
}